

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lista.cpp
# Opt level: O0

void __thiscall
Lista::Lista(Lista *this,string *nume,string *data,ReadingTracker *rt,MoodTracker *md)

{
  MoodTracker *md_local;
  ReadingTracker *rt_local;
  string *data_local;
  string *nume_local;
  Lista *this_local;
  
  this->_vptr_Lista = (_func_int **)&PTR__Lista_0011ebe8;
  std::__cxx11::string::string((string *)&this->nume,nume);
  std::__cxx11::string::string((string *)&this->data,data);
  std::vector<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_>::vector
            (&this->Taskuri);
  ReadingTracker::ReadingTracker(&this->rt,rt);
  MoodTracker::MoodTracker(&this->md,md);
  return;
}

Assistant:

Lista::Lista(const std::string &nume, const std::string &data, ReadingTracker &rt, MoodTracker &md) : nume(nume), data(data), rt(rt), md(md){}